

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double f_variance(int m,int n)

{
  if (4 < n) {
    return (double)((n + m + -2) * n * n * 2) / (double)((n + -4) * (n + -2) * m * (n + -2));
  }
  std::operator<<((ostream *)&std::cerr," \n");
  std::operator<<((ostream *)&std::cerr,"F_VARIANCE - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  The variance is not defined for N < 5.\n");
  exit(1);
}

Assistant:

double f_variance ( int m, int n )

//****************************************************************************80
//
//  Purpose:
//
//    F_VARIANCE returns the variance of the F central PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    17 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int M, N, the parameters of the PDF.
//    1 <= M,
//    1 <= N.
//    Note, however, that the variance is not defined unless 5 <= N.
//
//    Output, double F_VARIANCE, the variance of the PDF.
//
{
  double variance;

  if ( n < 5 )
  {
    cerr << " \n";
    cerr << "F_VARIANCE - Fatal error!\n";
    cerr << "  The variance is not defined for N < 5.\n";
    exit ( 1 );
  }

  variance = static_cast<double>( 2 * n * n * ( m + n - 2 ) ) /
    static_cast<double>( m * ( n - 2 ) * ( n - 2 ) * ( n - 4 ) );

  return variance;
}